

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBControlTransfers.cpp
# Opt level: O0

void __thiscall
USBHidRepDescItemFrame::PackFrame
          (USBHidRepDescItemFrame *this,U8 *pItem,U16 indentLevel,U16 usagePage)

{
  int iVar1;
  U8 itemSize;
  U16 usagePage_local;
  U16 indentLevel_local;
  U8 *pItem_local;
  USBHidRepDescItemFrame *this_local;
  
  iVar1 = GetNumHIDItemDataBytes(*pItem);
  memcpy(&this->field_0x10,pItem,(ulong)(byte)((char)iVar1 + 1));
  *(ulong *)&this->field_0x18 = (ulong)usagePage;
  *(long *)&this->field_0x18 = *(long *)&this->field_0x18 << 0x10;
  *(ulong *)&this->field_0x18 = (ulong)indentLevel | *(ulong *)&this->field_0x18;
  return;
}

Assistant:

void USBHidRepDescItemFrame::PackFrame( const U8* pItem, U16 indentLevel, U16 usagePage )
{
    // mData1 contains the 1 to 5 bytes of the HID item
    U8 itemSize = GetNumHIDItemDataBytes( pItem[ 0 ] ) + 1;
    memcpy( &mData1, pItem, itemSize );

    // mData2 format:
    //
    // 66665555 55555544 44444444 33333333 33222222 22221111 11111100 00000000
    // 32109876 54321098 76543210 98765432 10987654 32109876 54321098 76543210
    // ----------------- ----------------- ----usagePage---- ---indentLevel---

    // contains indentLevel and usagePage
    mData2 = usagePage;
    mData2 <<= 16;
    mData2 |= indentLevel;
}